

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fec.c
# Opt level: O3

int fec_decode(fec_t *fec,gf *pkts,uint *idxs,uint len)

{
  gf c;
  long lVar1;
  size_t __n;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint *puVar6;
  int iVar7;
  ulong uVar8;
  gf *b;
  ulong uVar9;
  gf *a;
  ulong uVar10;
  code *pcStack_70;
  gf *local_68;
  size_t local_60;
  fec_t *local_58;
  undefined1 *local_50;
  uint local_44;
  gf *local_40;
  uint *local_38;
  
  if (fec == (fec_t *)0x0) {
    pcStack_70 = fec_pkt_init;
    __assert_fail("fec != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/fec.c",0xcd,
                  "int fec_decode(fec_t *, gf *, unsigned int *, unsigned int)");
  }
  uVar2 = fec->k;
  iVar7 = 0;
  uVar3 = 0;
  if (uVar2 != 0) {
    uVar5 = 0;
    do {
      uVar3 = idxs[uVar5];
      if (uVar3 < uVar2 && uVar3 != uVar5) {
        if (idxs[uVar3] == uVar3) {
          return 0;
        }
        idxs[uVar5] = idxs[uVar3];
        idxs[uVar3] = uVar3;
        uVar2 = fec->k;
      }
      else {
        uVar5 = uVar5 + 1;
      }
      uVar3 = uVar2;
    } while (uVar5 < uVar2);
  }
  lVar1 = -((ulong)(uVar3 * uVar3) + 0xf & 0xfffffffffffffff0);
  local_68 = (gf *)((long)&local_68 + lVar1);
  local_38 = idxs;
  *(undefined8 *)((long)&pcStack_70 + lVar1) = 0x1060c5;
  iVar4 = fec_decode_matrix(fec,(gf *)((long)&local_68 + lVar1),idxs);
  if (iVar4 != 0) {
    uVar10 = (ulong)fec->k;
    if (fec->k != 0) {
      local_60 = (size_t)len;
      uVar9 = 0;
      puVar6 = local_38;
      local_58 = fec;
      local_50 = (undefined1 *)&local_68;
      local_44 = len;
      local_40 = pkts;
      do {
        __n = local_60;
        if ((uint)uVar10 <= puVar6[uVar9]) {
          a = local_40 + (int)uVar9 * len;
          uVar10 = 0;
          *(undefined8 *)((long)&pcStack_70 + lVar1) = 0x106126;
          memset(a,0,__n);
          puVar6 = local_38;
          if (local_58->k != 0) {
            uVar8 = 0;
            uVar10 = (ulong)local_58->k;
            do {
              b = local_40 + local_38[uVar8] * len;
              c = local_68[(uint)((int)uVar10 * (int)uVar9 + (int)uVar8)];
              *(undefined8 *)((long)&pcStack_70 + lVar1) = 0x106162;
              gf_add_mul(a,b,c,len);
              uVar8 = uVar8 + 1;
              uVar10 = (ulong)local_58->k;
              puVar6 = local_38;
            } while (uVar8 < uVar10);
          }
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 < uVar10);
    }
    iVar7 = 1;
  }
  return iVar7;
}

Assistant:

int fec_decode(fec_t *fec,
               gf *pkts,
               unsigned int idxs[], unsigned len) {
  assert(fec != NULL);
  
  if (!fec_shuffle(fec, idxs))
    return 0;

  /*M
    Build decoding matrix.
  **/
  gf dec_matrix[fec->k * fec->k];
  if (!fec_decode_matrix(fec, dec_matrix, idxs))
    return 0;

  unsigned int row;
  for (row = 0; row < fec->k; row++) {
    if (idxs[row] >= fec->k) {
      gf *pkt = pkts + row * len;
      
      bzero(pkt, len * sizeof(gf));
      unsigned int col;
      for (col = 0; col < fec->k; col++) {
        gf_add_mul(pkt, pkts + idxs[col] * len,
                   dec_matrix[row * fec->k + col], len);
      }
    }
  }

  return 1;
}